

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O1

key_e __thiscall libchars::editor::decode_key(editor *this,uint8_t c)

{
  byte bVar1;
  edit_object *peVar2;
  char *__s;
  bool bVar3;
  int iVar4;
  key_e kVar5;
  size_t sVar6;
  debug *this_00;
  ulong uVar7;
  key_e *pkVar8;
  bool bVar9;
  double __x;
  byte local_168 [8];
  char buffer [256];
  ulong local_40;
  key_e local_34;
  
  uVar7 = this->seq_N;
  if (uVar7 < 0x10) {
    this->seq_N = uVar7 + 1;
    this->seq[uVar7] = c;
    peVar2 = this->obj;
    local_40 = this->seq_N;
    pkVar8 = &DAT_0011b708;
    bVar9 = false;
    uVar7 = 0;
    do {
      __s = *(char **)(pkVar8 + -2);
      sVar6 = strlen(__s);
      iVar4 = bcmp(__s,this->seq,local_40);
      if (iVar4 == 0) {
        if (sVar6 == local_40) {
          this->seq_N = 0;
          if ((peVar2->mode == MODE_MULTILINE) && (*pkVar8 == KEY_DEL)) {
            local_34 = KEY_EOF;
          }
          else {
            local_34 = *pkVar8;
          }
          local_40 = 0;
        }
        else {
          if (sVar6 <= local_40) goto LAB_001103f2;
          local_34 = PARTIAL_SEQ;
        }
        bVar3 = false;
      }
      else {
LAB_001103f2:
        bVar3 = true;
      }
      if (!bVar3) break;
      bVar9 = 0x17 < uVar7;
      uVar7 = uVar7 + 1;
      pkVar8 = pkVar8 + 4;
    } while (uVar7 != 0x19);
    if (!bVar9) {
      return local_34;
    }
  }
  if ((1 < this->seq_N) || (iVar4 = isprint((uint)c), iVar4 == 0)) {
    memset(local_168,0,0x100);
    if (this->seq_N != 0) {
      uVar7 = 0;
      do {
        bVar1 = this->seq[uVar7];
        iVar4 = isprint((uint)bVar1);
        sVar6 = strlen((char *)local_168);
        if (iVar4 == 0) {
          sprintf((char *)(local_168 + sVar6),"\\x%02x",(ulong)bVar1);
        }
        else {
          local_168[sVar6] = bVar1;
          local_168[sVar6 + 1] = 0;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < this->seq_N);
    }
    this_00 = debug::initialize(0);
    debug::log(this_00,__x);
  }
  this->seq_N = 0;
  if ((c != '?') || (kVar5 = KEY_HELP, this->obj->mode != MODE_COMMAND)) {
    iVar4 = isprint((uint)c);
    kVar5 = (uint)(iVar4 == 0) * 2 + PRINTABLE_CHAR;
  }
  return kVar5;
}

Assistant:

key_e editor::decode_key(uint8_t c)
    {
        if (seq_N < MAX_DECODE_SEQUENCE) {
            seq[seq_N++] = c;
            size_t idx;
            for (idx = 0; idx < DECODE_TABLE_ENTRIES; ++idx) {
                const char *T_seq = __decode_table[idx].sequence;
                size_t T_seq_N = strlen(T_seq);
                if (memcmp(T_seq, seq, seq_N) == 0) {
                    if (T_seq_N == seq_N) {
                        seq_N = 0;
                        if (obj->mode == MODE_MULTILINE && __decode_table[idx].result == KEY_DEL)
                            return KEY_EOF;
                        else
                            return __decode_table[idx].result;
                    }
                    else if (T_seq_N > seq_N) {
                        return PARTIAL_SEQ;
                    }
                }
            }
        }

        if (seq_N>1 || !isprint(c)) {
            size_t i;
            char buffer[256] = "";
            for (i=0; i<seq_N; ++i) {
                uint8_t cc = seq[i];
                if (isprint(cc))
                    sprintf(buffer+strlen(buffer), "%c", cc);
                else
                    sprintf(buffer+strlen(buffer), "\\x%02x", cc);
            }
            LC_LOG_DEBUG("UNKNOWN SEQUENCE: --> %s <--",buffer);
        }

        seq_N = 0;

        if (obj->mode == MODE_COMMAND && c == '?')
            return KEY_HELP;
        else if (isprint(c))
            return PRINTABLE_CHAR;
        else
            return IGNORE_SEQ;
    }